

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

KeyFormatData *
cfd::core::GetKeyFormatFromVersion(KeyFormatData *__return_storage_ptr__,uint32_t version)

{
  bool bVar1;
  KeyFormatData *extraout_RAX;
  CfdException *this;
  KeyFormatData *this_00;
  undefined1 local_40 [32];
  
  GetKeyFormatList();
  this_00 = (KeyFormatData *)local_40._0_8_;
  while( true ) {
    if (this_00 == (KeyFormatData *)local_40._8_8_) {
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 local_40);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._0_8_ = local_40 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"unsupported extkey version.","");
      CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar1 = KeyFormatData::IsFindVersion(this_00,version);
    if (bVar1) break;
    this_00 = this_00 + 1;
  }
  KeyFormatData::KeyFormatData(__return_storage_ptr__,this_00);
  ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
            ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)local_40
            );
  return extraout_RAX;
}

Assistant:

static KeyFormatData GetKeyFormatFromVersion(uint32_t version) {
  for (const auto& format_data : GetKeyFormatList()) {
    if (format_data.IsFindVersion(version)) {
      return format_data;
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported extkey version.");
}